

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O1

int build_loop_tree(gen_ctx_t gen_ctx)

{
  uint uVar1;
  VARR_loop_node_t *pVVar2;
  bb_t pbVar3;
  bitmap_t pVVar4;
  gen_ctx_t pgVar5;
  void *pvVar6;
  loop_node_t plVar7;
  func_cfg_t pfVar8;
  int extraout_EAX;
  int extraout_EAX_00;
  loop_node_t_conflict plVar9;
  in_edge_t_conflict peVar10;
  ulong uVar11;
  loop_node_t_conflict *pplVar12;
  ulong uVar13;
  bb_t pbVar14;
  VARR_loop_node_t *pVVar15;
  loop_node_t_conflict plVar16;
  loop_node_t_conflict elem;
  FILE *__s;
  gen_ctx_t gen_ctx_00;
  size_t sVar17;
  bb_t_conflict pbVar18;
  
  gen_ctx->curr_loop_node_index = 0;
  gen_ctx_00 = gen_ctx;
  enumerate_bbs(gen_ctx);
  pVVar15 = gen_ctx->loop_entries;
  if ((pVVar15 != (VARR_loop_node_t *)0x0) && (pVVar15->varr != (loop_node_t_conflict *)0x0)) {
    pVVar15->els_num = 0;
    for (pbVar18 = (gen_ctx->curr_cfg->bbs).head; pbVar18 != (bb_t_conflict)0x0;
        pbVar18 = (pbVar18->bb_link).next) {
      gen_ctx_00 = gen_ctx;
      plVar9 = create_loop_node(gen_ctx,pbVar18);
      plVar9->entry = plVar9;
      for (peVar10 = (pbVar18->in_edges).head; peVar10 != (in_edge_t_conflict)0x0;
          peVar10 = (peVar10->in_link).next) {
        if (peVar10->back_edge_p != '\0') {
          pVVar15 = gen_ctx->loop_entries;
          gen_ctx_00 = (gen_ctx_t)pVVar15->varr;
          if (gen_ctx_00 == (gen_ctx_t)0x0) goto LAB_00156ed2;
          uVar11 = pVVar15->els_num + 1;
          if (pVVar15->size < uVar11) {
            sVar17 = (uVar11 >> 1) + uVar11;
            pplVar12 = (loop_node_t_conflict *)realloc(gen_ctx_00,sVar17 * 8);
            pVVar15->varr = pplVar12;
            pVVar15->size = sVar17;
          }
          sVar17 = pVVar15->els_num;
          pVVar15->els_num = sVar17 + 1;
          pVVar15->varr[sVar17] = plVar9;
          break;
        }
      }
    }
    pVVar15 = gen_ctx->loop_entries;
    if (pVVar15 == (VARR_loop_node_t *)0x0) goto LAB_00156edc;
    gen_ctx_00 = (gen_ctx_t)pVVar15->varr;
    qsort(gen_ctx_00,pVVar15->els_num,8,compare_bb_loop_nodes);
    pVVar15 = gen_ctx->loop_entries;
    if (pVVar15 != (VARR_loop_node_t *)0x0) {
      uVar11 = 0;
LAB_001569ec:
      if (pVVar15->els_num <= uVar11) goto LAB_00156e07;
      if (pVVar15->varr != (loop_node_t_conflict *)0x0) {
        pVVar2 = gen_ctx->loop_nodes;
        if ((pVVar2 == (VARR_loop_node_t *)0x0) || (pVVar2->varr == (loop_node_t_conflict *)0x0))
        goto LAB_00156eb4;
        pbVar3 = pVVar15->varr[uVar11]->bb;
        pVVar2->els_num = 0;
        pVVar15 = gen_ctx->queue_nodes;
        if ((pVVar15 == (VARR_loop_node_t *)0x0) || (pVVar15->varr == (loop_node_t_conflict *)0x0))
        goto LAB_00156eb9;
        pVVar15->els_num = 0;
        pVVar4 = gen_ctx->temp_bitmap;
        if ((pVVar4 != (bitmap_t)0x0) && (pVVar4->varr != (bitmap_el_t *)0x0)) {
          pVVar4->els_num = 0;
          for (peVar10 = (pbVar3->in_edges).head; peVar10 != (in_edge_t_conflict)0x0;
              peVar10 = (peVar10->in_link).next) {
            if ((peVar10->back_edge_p != '\0') && (peVar10->src != pbVar3)) {
              plVar9 = peVar10->src->loop_node;
              do {
                plVar16 = plVar9;
                plVar9 = plVar16->parent;
              } while (plVar16->parent != (loop_node_t)0x0);
              pgVar5 = (gen_ctx_t)gen_ctx->temp_bitmap;
              uVar1 = plVar16->index;
              uVar13 = (ulong)uVar1;
              gen_ctx_00 = pgVar5;
              bitmap_expand((bitmap_t)pgVar5,uVar13 + 1);
              if (pgVar5 == (gen_ctx_t)0x0) goto LAB_00156ea5;
              uVar1 = uVar1 >> 6;
              pvVar6 = (&pgVar5->curr_func_item->data)[uVar1];
              (&pgVar5->curr_func_item->data)[uVar1] =
                   (void *)((ulong)pvVar6 | 1L << (uVar13 & 0x3f));
              if ((((ulong)pvVar6 >> (uVar13 & 0x3f) & 1) == 0) &&
                 ((peVar10->src->pre != 0 || (peVar10->src->rpost != 0)))) {
                pVVar15 = gen_ctx->loop_nodes;
                gen_ctx_00 = (gen_ctx_t)pVVar15->varr;
                if (gen_ctx_00 == (gen_ctx_t)0x0) goto LAB_00156eaa;
                uVar13 = pVVar15->els_num + 1;
                if (pVVar15->size < uVar13) {
                  sVar17 = (uVar13 >> 1) + uVar13;
                  pplVar12 = (loop_node_t_conflict *)realloc(gen_ctx_00,sVar17 * 8);
                  pVVar15->varr = pplVar12;
                  pVVar15->size = sVar17;
                }
                sVar17 = pVVar15->els_num;
                pVVar15->els_num = sVar17 + 1;
                pVVar15->varr[sVar17] = plVar16;
                pVVar15 = gen_ctx->queue_nodes;
                gen_ctx_00 = (gen_ctx_t)pVVar15->varr;
                if (gen_ctx_00 == (gen_ctx_t)0x0) goto LAB_00156eaf;
                uVar13 = pVVar15->els_num + 1;
                if (pVVar15->size < uVar13) {
                  sVar17 = (uVar13 >> 1) + uVar13;
                  pplVar12 = (loop_node_t_conflict *)realloc(gen_ctx_00,sVar17 * 8);
                  pVVar15->varr = pplVar12;
                  pVVar15->size = sVar17;
                }
                sVar17 = pVVar15->els_num;
                pVVar15->els_num = sVar17 + 1;
                pVVar15->varr[sVar17] = plVar16;
              }
            }
          }
          do {
            pVVar15 = gen_ctx->queue_nodes;
            if (pVVar15 == (VARR_loop_node_t *)0x0) {
LAB_00156e96:
              build_loop_tree_cold_12();
LAB_00156e9b:
              build_loop_tree_cold_8();
              goto LAB_00156ea0;
            }
            sVar17 = pVVar15->els_num;
            if (sVar17 == 0) {
              pVVar15 = gen_ctx->loop_nodes;
              gen_ctx_00 = (gen_ctx_t)pVVar15->varr;
              if (gen_ctx_00 == (gen_ctx_t)0x0) goto LAB_00156ecd;
              plVar7 = pbVar3->loop_node;
              uVar13 = pVVar15->els_num + 1;
              if (pVVar15->size < uVar13) {
                sVar17 = (uVar13 >> 1) + uVar13;
                pplVar12 = (loop_node_t_conflict *)realloc(gen_ctx_00,sVar17 * 8);
                pVVar15->varr = pplVar12;
                pVVar15->size = sVar17;
              }
              sVar17 = pVVar15->els_num;
              pVVar15->els_num = sVar17 + 1;
              pVVar15->varr[sVar17] = plVar7;
              gen_ctx_00 = gen_ctx;
              plVar9 = create_loop_node(gen_ctx,(bb_t_conflict)0x0);
              plVar9->entry = plVar7;
              pVVar15 = gen_ctx->loop_nodes;
              if (pVVar15 == (VARR_loop_node_t *)0x0) goto LAB_00156e02;
              goto LAB_00156dc1;
            }
            if (pVVar15->varr == (loop_node_t_conflict *)0x0) goto LAB_00156e9b;
            pVVar15->els_num = sVar17 - 1;
            plVar9 = pVVar15->varr[sVar17 - 1];
            pbVar14 = plVar9->bb;
            if (pbVar14 == (bb_t)0x0) {
              pbVar14 = plVar9->entry->bb;
            }
            if (pbVar14 == (gen_ctx->curr_cfg->bbs).head) goto LAB_00156d2a;
            for (peVar10 = (pbVar14->in_edges).head; peVar10 != (in_edge_t_conflict)0x0;
                peVar10 = (peVar10->in_link).next) {
              if (peVar10->src != pbVar3) {
                plVar9 = peVar10->src->loop_node;
                do {
                  plVar16 = plVar9;
                  plVar9 = plVar16->parent;
                } while (plVar16->parent != (loop_node_t)0x0);
                pgVar5 = (gen_ctx_t)gen_ctx->temp_bitmap;
                uVar1 = plVar16->index;
                uVar13 = (ulong)uVar1;
                gen_ctx_00 = pgVar5;
                bitmap_expand((bitmap_t)pgVar5,uVar13 + 1);
                if (pgVar5 == (gen_ctx_t)0x0) {
                  build_loop_tree_cold_7();
LAB_00156e8c:
                  build_loop_tree_cold_5();
LAB_00156e91:
                  build_loop_tree_cold_6();
                  goto LAB_00156e96;
                }
                uVar1 = uVar1 >> 6;
                pvVar6 = (&pgVar5->curr_func_item->data)[uVar1];
                (&pgVar5->curr_func_item->data)[uVar1] =
                     (void *)((ulong)pvVar6 | 1L << (uVar13 & 0x3f));
                if ((((ulong)pvVar6 >> (uVar13 & 0x3f) & 1) == 0) &&
                   ((peVar10->src->pre != 0 || (peVar10->src->rpost != 0)))) {
                  pVVar15 = gen_ctx->loop_nodes;
                  gen_ctx_00 = (gen_ctx_t)pVVar15->varr;
                  if (gen_ctx_00 == (gen_ctx_t)0x0) goto LAB_00156e91;
                  uVar13 = pVVar15->els_num + 1;
                  if (pVVar15->size < uVar13) {
                    sVar17 = (uVar13 >> 1) + uVar13;
                    pplVar12 = (loop_node_t_conflict *)realloc(gen_ctx_00,sVar17 * 8);
                    pVVar15->varr = pplVar12;
                    pVVar15->size = sVar17;
                  }
                  sVar17 = pVVar15->els_num;
                  pVVar15->els_num = sVar17 + 1;
                  pVVar15->varr[sVar17] = plVar16;
                  pVVar15 = gen_ctx->queue_nodes;
                  gen_ctx_00 = (gen_ctx_t)pVVar15->varr;
                  if (gen_ctx_00 == (gen_ctx_t)0x0) goto LAB_00156e8c;
                  uVar13 = pVVar15->els_num + 1;
                  if (pVVar15->size < uVar13) {
                    sVar17 = (uVar13 >> 1) + uVar13;
                    pplVar12 = (loop_node_t_conflict *)realloc(gen_ctx_00,sVar17 * 8);
                    pVVar15->varr = pplVar12;
                    pVVar15->size = sVar17;
                  }
                  sVar17 = pVVar15->els_num;
                  pVVar15->els_num = sVar17 + 1;
                  pVVar15->varr[sVar17] = plVar16;
                }
              }
            }
          } while( true );
        }
        goto LAB_00156ebe;
      }
      goto LAB_00156ec8;
    }
LAB_00156ec3:
    build_loop_tree_cold_17();
LAB_00156ec8:
    build_loop_tree_cold_16();
LAB_00156ecd:
    build_loop_tree_cold_11();
LAB_00156ed2:
    build_loop_tree_cold_1();
  }
  build_loop_tree_cold_19();
LAB_00156edc:
  build_loop_tree_cold_18();
  if (gen_ctx_00->curr_cfg->root_loop_node == (loop_node_t_conflict)0x0) {
    return (int)gen_ctx_00->curr_cfg;
  }
  __s = (FILE *)gen_ctx_00->debug_file;
  fwrite("Loop Tree\n",10,1,__s);
  print_loop_subtree(gen_ctx_00,gen_ctx_00->curr_cfg->root_loop_node,0,(int)__s);
  return extraout_EAX_00;
LAB_00156dc1:
  sVar17 = pVVar15->els_num;
  if (sVar17 == 0) goto LAB_00156d2a;
  if (pVVar15->varr == (loop_node_t_conflict *)0x0) goto LAB_00156ea0;
  pVVar15->els_num = sVar17 - 1;
  plVar16 = pVVar15->varr[sVar17 - 1];
  gen_ctx_00 = (gen_ctx_t)&plVar9->children;
  DLIST_loop_node_t_append(&plVar9->children,plVar16);
  plVar16->parent = plVar9;
  pVVar15 = gen_ctx->loop_nodes;
  if (pVVar15 == (VARR_loop_node_t *)0x0) goto LAB_00156e02;
  goto LAB_00156dc1;
LAB_00156d2a:
  uVar11 = uVar11 + 1;
  pVVar15 = gen_ctx->loop_entries;
  if (pVVar15 == (VARR_loop_node_t *)0x0) goto LAB_00156ec3;
  goto LAB_001569ec;
LAB_00156ea0:
  build_loop_tree_cold_9();
LAB_00156ea5:
  build_loop_tree_cold_4();
LAB_00156eaa:
  build_loop_tree_cold_3();
LAB_00156eaf:
  build_loop_tree_cold_2();
LAB_00156eb4:
  build_loop_tree_cold_15();
LAB_00156eb9:
  build_loop_tree_cold_14();
LAB_00156ebe:
  build_loop_tree_cold_13();
  goto LAB_00156ec3;
LAB_00156e02:
  build_loop_tree_cold_10();
LAB_00156e07:
  plVar9 = (loop_node_t_conflict)0x0;
  plVar16 = create_loop_node(gen_ctx,(bb_t_conflict)0x0);
  pfVar8 = gen_ctx->curr_cfg;
  pfVar8->root_loop_node = plVar16;
  for (pbVar18 = (pfVar8->bbs).head; pbVar18 != (bb_t_conflict)0x0;
      pbVar18 = (pbVar18->bb_link).next) {
    plVar16 = pbVar18->loop_node;
    do {
      elem = plVar16;
      plVar16 = elem->parent;
    } while (elem->parent != (loop_node_t)0x0);
    plVar16 = gen_ctx->curr_cfg->root_loop_node;
    if (elem != plVar16) {
      plVar9 = elem;
      DLIST_loop_node_t_append(&plVar16->children,elem);
      elem->parent = gen_ctx->curr_cfg->root_loop_node;
    }
  }
  setup_loop_pressure((gen_ctx_t)gen_ctx->curr_cfg->root_loop_node,plVar9);
  return extraout_EAX;
}

Assistant:

static int build_loop_tree (gen_ctx_t gen_ctx) {
  loop_node_t loop_node;
  edge_t e;
  int loops_p = FALSE;

  curr_loop_node_index = 0;
  enumerate_bbs (gen_ctx);
  VARR_TRUNC (loop_node_t, loop_entries, 0);
  for (bb_t bb = DLIST_HEAD (bb_t, curr_cfg->bbs); bb != NULL; bb = DLIST_NEXT (bb_t, bb)) {
    loop_node = create_loop_node (gen_ctx, bb);
    loop_node->entry = loop_node;
    for (e = DLIST_HEAD (in_edge_t, bb->in_edges); e != NULL; e = DLIST_NEXT (in_edge_t, e))
      if (e->back_edge_p) {
        VARR_PUSH (loop_node_t, loop_entries, loop_node);
        break;
      }
  }
  qsort (VARR_ADDR (loop_node_t, loop_entries), VARR_LENGTH (loop_node_t, loop_entries),
         sizeof (loop_node_t), compare_bb_loop_nodes);
  for (size_t i = 0; i < VARR_LENGTH (loop_node_t, loop_entries); i++)
    if (process_loop (gen_ctx, VARR_GET (loop_node_t, loop_entries, i)->bb)) loops_p = TRUE;
  curr_cfg->root_loop_node = create_loop_node (gen_ctx, NULL);
  for (bb_t bb = DLIST_HEAD (bb_t, curr_cfg->bbs); bb != NULL; bb = DLIST_NEXT (bb_t, bb))
    if ((loop_node = top_loop_node (bb)) != curr_cfg->root_loop_node) {
      DLIST_APPEND (loop_node_t, curr_cfg->root_loop_node->children, loop_node);
      loop_node->parent = curr_cfg->root_loop_node;
    }
  setup_loop_pressure (gen_ctx, curr_cfg->root_loop_node);
  return loops_p;
}